

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall testing::internal::ExpectationBase::~ExpectationBase(ExpectationBase *this)

{
  undefined8 *in_RDI;
  Mutex *unaff_retaddr;
  
  *in_RDI = &PTR__ExpectationBase_001c6078;
  Mutex::~Mutex(unaff_retaddr);
  std::vector<const_void_*,_std::allocator<const_void_*>_>::~vector
            ((vector<const_void_*,_std::allocator<const_void_*>_> *)unaff_retaddr);
  ExpectationSet::~ExpectationSet((ExpectationSet *)0x1547dc);
  Cardinality::~Cardinality((Cardinality *)0x1547ea);
  std::__cxx11::string::~string((string *)(in_RDI + 3));
  return;
}

Assistant:

ExpectationBase::~ExpectationBase() {}